

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O0

void __thiscall
ModelFlattening_flatteningModelsRequiringUnitsNameChangesInvolvingImportedComponents_Test::TestBody
          (ModelFlattening_flatteningModelsRequiringUnitsNameChangesInvolvingImportedComponents_Test
           *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertHelper local_160 [8];
  Message local_158 [8];
  void *local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar;
  ModelPtr flatModel;
  AssertHelper local_108 [8];
  Message local_100 [15];
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_;
  string local_d8 [32];
  string local_b8 [55];
  allocator<char> local_81;
  string local_80 [32];
  string local_60 [32];
  undefined1 local_40 [8];
  ModelPtr model;
  ParserPtr parser;
  ImporterPtr importer;
  ModelFlattening_flatteningModelsRequiringUnitsNameChangesInvolvingImportedComponents_Test
  *this_local;
  
  libcellml::Importer::create((bool)((char)&parser + '\b'));
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_80,"importer/HHComplete/MembraneModel.cellml",&local_81);
  fileContents(local_60);
  libcellml::Parser::parseModel((string *)local_40);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  peVar3 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,"importer/HHComplete",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7))
  ;
  resourcePath(local_b8);
  libcellml::Importer::resolveImports((shared_ptr *)peVar3,(string *)local_40);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_40);
  bVar1 = libcellml::Model::hasUnresolvedImports();
  local_f1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f0,&local_f1,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar2) {
    testing::Message::Message(local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)
               &flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_f0,"model->hasUnresolvedImports()","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x73a,pcVar4);
    testing::internal::AssertHelper::operator=(local_108,local_100);
    testing::internal::AssertHelper::~AssertHelper(local_108);
    std::__cxx11::string::~string
              ((string *)
               &flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Importer::flattenModel((shared_ptr *)&gtest_ar.message_);
  local_150 = (void *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),std::shared_ptr<libcellml::Model>>
            ((internal *)local_148,"nullptr","flatModel",&local_150,
             (shared_ptr<libcellml::Model> *)&gtest_ar.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar2) {
    testing::Message::Message(local_158);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              (local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x73d,pcVar4);
    testing::internal::AssertHelper::operator=(local_160,local_158);
    testing::internal::AssertHelper::~AssertHelper(local_160);
    testing::Message::~Message(local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)&gtest_ar.message_)
  ;
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_40);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Importer>::~shared_ptr
            ((shared_ptr<libcellml::Importer> *)
             &parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(ModelFlattening, flatteningModelsRequiringUnitsNameChangesInvolvingImportedComponents)
{
    auto importer = libcellml::Importer::create();
    auto parser = libcellml::Parser::create();

    auto model = parser->parseModel(fileContents("importer/HHComplete/MembraneModel.cellml"));
    importer->resolveImports(model, resourcePath("importer/HHComplete"));

    EXPECT_FALSE(model->hasUnresolvedImports());

    auto flatModel = importer->flattenModel(model);
    EXPECT_NE(nullptr, flatModel);
}